

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O3

void av1_upsample_intra_edge_c(uint8_t *p,int sz)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint8_t in [19];
  byte local_36 [30];
  
  bVar1 = p[-1];
  if (0 < sz) {
    memcpy(local_36,p,(ulong)(uint)sz);
  }
  local_36[sz] = p[(long)sz + -1];
  p[-2] = bVar1;
  if (0 < sz) {
    uVar5 = 0;
    uVar2 = (uint)bVar1;
    uVar3 = (uint)bVar1;
    do {
      uVar4 = uVar2;
      bVar1 = local_36[uVar5 + 1];
      iVar6 = (int)(((local_36[0] + uVar4) * 9 - (uVar3 + bVar1)) + 8) >> 4;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      if (0xfe < iVar6) {
        iVar6 = 0xff;
      }
      p[uVar5 * 2 + -1] = (uint8_t)iVar6;
      p[uVar5 * 2] = local_36[0];
      uVar5 = uVar5 + 1;
      uVar2 = (uint)local_36[0];
      uVar3 = uVar4;
      local_36[0] = bVar1;
    } while ((uint)sz != uVar5);
  }
  return;
}

Assistant:

void av1_upsample_intra_edge_c(uint8_t *p, int sz) {
  // interpolate half-sample positions
  assert(sz <= MAX_UPSAMPLE_SZ);

  uint8_t in[MAX_UPSAMPLE_SZ + 3];
  // copy p[-1..(sz-1)] and extend first and last samples
  in[0] = p[-1];
  in[1] = p[-1];
  for (int i = 0; i < sz; i++) {
    in[i + 2] = p[i];
  }
  in[sz + 2] = p[sz - 1];

  // interpolate half-sample edge positions
  p[-2] = in[0];
  for (int i = 0; i < sz; i++) {
    int s = -in[i] + (9 * in[i + 1]) + (9 * in[i + 2]) - in[i + 3];
    s = clip_pixel((s + 8) >> 4);
    p[2 * i - 1] = s;
    p[2 * i] = in[i + 2];
  }
}